

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iutest::internal::
CmpHelperEQ<std::tuple<int,int,int,int,int,int,int,int,int,int>,std::tuple<int,int,int,int,int,int,int,int,int,int>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *expected,
          tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *actual)

{
  bool bVar1;
  tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *ptVar2;
  string local_68;
  string local_48;
  
  ptVar2 = (tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *)actual_str;
  if ((((expected->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
        super__Head_base<0UL,_int,_false>._M_head_impl == *(int *)(actual_str + 0x24)) &&
      ((expected->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
       super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
       super__Head_base<1UL,_int,_false>._M_head_impl == *(int *)(actual_str + 0x20))) &&
     (bVar1 = std::
              __tuple_compare<std::tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int>,_std::tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int>,_2UL,_10UL>
              ::__eq(expected,(tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *)actual_str)
     , bVar1)) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
    return __return_storage_ptr__;
  }
  FormatForComparisonFailureMessage<std::tuple<int,int,int,int,int,int,int,int,int,int>,std::tuple<int,int,int,int,int,int,int,int,int,int>>
            (&local_48,(internal *)actual_str,expected,ptVar2);
  FormatForComparisonFailureMessage<std::tuple<int,int,int,int,int,int,int,int,int,int>,std::tuple<int,int,int,int,int,int,int,int,int,int>>
            (&local_68,(internal *)expected,
             (tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *)actual_str,ptVar2);
  EqFailure(__return_storage_ptr__,(char *)this,expected_str,&local_48,&local_68,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }